

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkUnitAddition(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  const_reference pvVar4;
  size_type sVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar7;
  double dVar8;
  precise_unit pVar9;
  double res;
  precise_unit b_unit;
  precise_unit a_unit;
  size_t sep;
  uint64_t in_stack_00000d38;
  string *in_stack_00000d40;
  precise_unit *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  precise_unit *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  precise_unit *in_stack_fffffffffffffe70;
  unit_data local_14c;
  double local_148;
  undefined1 local_140 [32];
  precise_unit local_120;
  precise_unit local_f0;
  precise_unit local_c0;
  precise_unit local_90;
  precise_unit local_80;
  precise_unit local_70 [2];
  allocator<char> local_49 [33];
  size_t local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  precise_unit local_10;
  
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (allocator<char> *)in_stack_fffffffffffffe50);
  sVar3 = findOperatorSep(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(in_stack_fffffffffffffe20);
  std::allocator<char>::~allocator(local_49);
  if ((sVar3 != 0xffffffffffffffff) && (sVar3 != 0)) {
    local_28 = sVar3;
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
    sVar3 = local_28;
    if ((*pvVar4 == '+') ||
       ((sVar5 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_18),
        sVar3 == sVar5 - 1 ||
        (pvVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                            (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18),
        *pvVar4 == '+')))) {
      local_10.multiplier_ = NAN;
      local_10.base_units_ = (unit_data)0xfa94a488;
      local_10.commodity_ = 0;
      goto LAB_00788de5;
    }
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
    if ((*pvVar4 == 'e') ||
       (pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18),
       *pvVar4 == 'E')) {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      bVar1 = isDigitCharacter(*pvVar4);
      if ((bVar1) && (1 < local_28)) {
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
        bVar1 = isDigitCharacter(*pvVar4);
        if (bVar1) {
          local_10.multiplier_ = NAN;
          local_10.base_units_ = (unit_data)0xfa94a488;
          local_10.commodity_ = 0;
          goto LAB_00788de5;
        }
      }
    }
    precise_unit::precise_unit(in_stack_fffffffffffffe70);
    precise_unit::precise_unit(in_stack_fffffffffffffe70);
    uVar6 = local_28 + 1;
    sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(local_18);
    if (sVar5 >> 1 < uVar6) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe38,(size_type)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28);
      local_90 = unit_from_string_internal(in_stack_00000d40,in_stack_00000d38);
      local_80 = local_90;
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      bVar1 = is_valid(in_stack_fffffffffffffe30);
      if (!bVar1) {
        local_10.multiplier_ = NAN;
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        goto LAB_00788de5;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe38,(size_type)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28);
      local_c0 = unit_from_string_internal(in_stack_00000d40,in_stack_00000d38);
      local_70[0] = local_c0;
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      bVar1 = is_valid(in_stack_fffffffffffffe30);
      if (!bVar1) {
        local_10.multiplier_ = NAN;
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        goto LAB_00788de5;
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe38,(size_type)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe28);
      local_f0 = unit_from_string_internal(in_stack_00000d40,in_stack_00000d38);
      local_70[0] = local_f0;
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      bVar1 = is_valid(in_stack_fffffffffffffe30);
      if (!bVar1) {
        local_10.multiplier_ = NAN;
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        goto LAB_00788de5;
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffe38,(size_type)in_stack_fffffffffffffe30,(size_type)local_140
                );
      pVar9 = unit_from_string_internal(in_stack_00000d40,in_stack_00000d38);
      local_120 = pVar9;
      local_80 = pVar9;
      std::__cxx11::string::~string(in_stack_fffffffffffffe20);
      bVar1 = is_valid(pVar9._8_8_);
      if (!bVar1) {
        local_10.multiplier_ = NAN;
        local_10.base_units_ = (unit_data)0xfa94a488;
        local_10.commodity_ = 0;
        goto LAB_00788de5;
      }
    }
    local_148 = convert<units::precise_unit,units::precise_unit>
                          ((precise_unit *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    uVar2 = std::isnan(local_148);
    if ((uVar2 & 1) == 0) {
      dVar7 = precise_unit::multiplier(local_70);
      dVar8 = precise_unit::multiplier(local_70);
      dVar7 = dVar8 * local_148 + dVar7;
      local_14c = precise_unit::base_units(local_70);
      precise_unit::precise_unit(&local_10,dVar7,&local_14c);
      goto LAB_00788de5;
    }
  }
  local_10.multiplier_ = NAN;
  local_10.base_units_ = (unit_data)0xfa94a488;
  local_10.commodity_ = 0;
LAB_00788de5:
  pVar9.base_units_ = local_10.base_units_;
  pVar9.commodity_ = local_10.commodity_;
  pVar9.multiplier_ = local_10.multiplier_;
  return pVar9;
}

Assistant:

static precise_unit
    checkUnitAddition(const std::string& unit_string, std::uint64_t match_flags)
{
    auto sep = findOperatorSep(unit_string, "+");
    if (sep != std::string::npos && sep > 0) {
        if ((unit_string[sep - 1] == '+') || sep == unit_string.size() - 1 ||
            unit_string[sep + 1] == '+') {
            return precise::invalid;
        }
        if (unit_string[sep - 1] == 'e' || unit_string[sep - 1] == 'E') {
            // this is scientific notation not addition
            if (isDigitCharacter(unit_string[sep + 1]) &&
                (sep > 1 && isDigitCharacter(unit_string[sep - 2]))) {
                return precise::invalid;
            }
        }
        precise_unit a_unit;
        precise_unit b_unit;
        if (sep + 1 > unit_string.size() / 2) {
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
        } else {
            a_unit = unit_from_string_internal(
                unit_string.substr(0, sep), match_flags);

            if (!is_valid(a_unit)) {
                return precise::invalid;
            }
            b_unit = unit_from_string_internal(
                unit_string.substr(sep + 1), match_flags);
            if (!is_valid(b_unit)) {
                return precise::invalid;
            }
        }
        auto res = convert(b_unit, a_unit);
        if (!std::isnan(res)) {
            return {
                a_unit.multiplier() + a_unit.multiplier() * res,
                a_unit.base_units()};
        }
    }
    return precise::invalid;
}